

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O2

RK_S32 mpp_dec_push_display(Mpp *mpp,HalDecTaskFlag flags)

{
  MppBufSlots slots;
  MPP_RET MVar1;
  RK_U32 RVar2;
  int iVar3;
  HalDecTaskFlag flags_00;
  RK_S32 index;
  MppDec local_38;
  
  index = -1;
  local_38 = mpp->mDec;
  slots = *(MppBufSlots *)((long)local_38 + 0x30);
  if (*(long *)((long)local_38 + 0x28) != 0) {
    pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)local_38 + 0x28) + 0xb8));
  }
  flags_00.val = flags.val & 0xfffffffffffffffc;
  iVar3 = 0;
  while( true ) {
    MVar1 = mpp_buf_slot_dequeue(slots,&index,QUEUE_DISPLAY);
    if (MVar1 != MPP_OK) break;
    if ((flags.val & 1) != 0) {
      RVar2 = mpp_slots_is_empty(slots,QUEUE_DISPLAY);
      flags_00.val = flags_00.val | RVar2 != 0;
    }
    mpp_dec_put_frame(mpp,index,flags_00);
    mpp_buf_slot_clr_flag(slots,index,SLOT_QUEUE_USE);
    iVar3 = iVar3 + 1;
  }
  if (*(long *)((long)local_38 + 0x28) != 0) {
    pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)local_38 + 0x28) + 0xb8));
  }
  return iVar3;
}

Assistant:

RK_S32 mpp_dec_push_display(Mpp *mpp, HalDecTaskFlag flags)
{
    RK_S32 index = -1;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots frame_slots = dec->frame_slots;
    RK_U32 eos = flags.eos;
    HalDecTaskFlag tmp = flags;
    RK_S32 ret = 0;

    tmp.eos = 0;
    /**
     * After info_change is encountered by parser thread, HalDecTaskFlag will
     * have this flag set. Although mpp_dec_flush is called there may be some
     * frames still remaining in display queue and waiting to be output. So
     * these frames shouldn't have info_change set since their resolution and
     * bit depth are the same as before. What's more, the info_change flag has
     * nothing to do with frames being output.
     */
    tmp.info_change = 0;

    if (dec->thread_hal)
        dec->thread_hal->lock(THREAD_OUTPUT);

    while (MPP_OK == mpp_buf_slot_dequeue(frame_slots, &index, QUEUE_DISPLAY)) {
        /* deal with current frame */
        if (eos && mpp_slots_is_empty(frame_slots, QUEUE_DISPLAY))
            tmp.eos = 1;

        mpp_dec_put_frame(mpp, index, tmp);
        mpp_buf_slot_clr_flag(frame_slots, index, SLOT_QUEUE_USE);
        ret++;
    }

    if (dec->thread_hal)
        dec->thread_hal->unlock(THREAD_OUTPUT);

    return ret;
}